

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Event.h
# Opt level: O3

bool __thiscall
axl::sys::NameableEventBase<axl::sl::False>::create
          (NameableEventBase<axl::sl::False> *this,StringRef *name)

{
  bool bVar1;
  int iVar2;
  pthread_cond_t *__cond;
  EVP_PKEY_CTX *src;
  SharedMemory sharedMemory;
  MutexAttr mutexAttr;
  CondAttr condAttr;
  Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> local_2c;
  pthread_mutexattr_t local_28;
  pthread_condattr_t local_24;
  
  close(this,(int)name);
  pthread_condattr_init(&local_24);
  pthread_mutexattr_init(&local_28);
  bVar1 = psx::CondAttr::setProcessShared((CondAttr *)&local_24,1);
  if (bVar1) {
    bVar1 = psx::MutexAttr::setProcessShared((MutexAttr *)&local_28,1);
    if (bVar1) {
      local_2c.m_h = -1;
      iVar2 = io::psx::SharedMemory::open((SharedMemory *)&local_2c,(char *)name,0xc2,0x1b6);
      if ((char)iVar2 == '\0') {
LAB_0014ec3f:
        bVar1 = false;
      }
      else {
        iVar2 = ftruncate64(local_2c.m_h,0x60);
        if (iVar2 == -1) {
          err::setLastSystemError();
LAB_0014ec37:
          io::psx::SharedMemory::unlink((char *)name);
          goto LAB_0014ec3f;
        }
        __cond = (pthread_cond_t *)
                 io::psx::Mapping::map(&this->m_mapping,(void *)0x0,0x60,3,1,local_2c.m_h,0);
        this->m_event = (EventImpl *)__cond;
        if (__cond == (pthread_cond_t *)0x0) goto LAB_0014ec37;
        pthread_cond_init(__cond,&local_24);
        pthread_mutex_init((pthread_mutex_t *)(__cond + 1),&local_28);
        *(undefined1 *)((long)__cond + 0x58) = 0;
        bVar1 = true;
        sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
                  (&this->m_name,(EVP_PKEY_CTX *)name,src);
      }
      sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle(&local_2c);
      goto LAB_0014ec4b;
    }
  }
  bVar1 = false;
LAB_0014ec4b:
  pthread_mutexattr_destroy(&local_28);
  pthread_condattr_destroy(&local_24);
  return bVar1;
}

Assistant:

bool
	create(const sl::StringRef& name) {
		close();

		psx::CondAttr condAttr;
		psx::MutexAttr mutexAttr;

		bool result =
			condAttr.setProcessShared(PTHREAD_PROCESS_SHARED) &&
			mutexAttr.setProcessShared(PTHREAD_PROCESS_SHARED);

		if (!result)
			return false;

		io::psx::SharedMemory sharedMemory;
		result = sharedMemory.open(name, O_RDWR | O_CREAT | O_EXCL);
		if (!result)
			return false;

		result =
			sharedMemory.setSize(sizeof(EventImpl)) &&
			(m_event = (EventImpl*)m_mapping.map(
				NULL,
				sizeof(EventImpl),
				PROT_READ | PROT_WRITE,
				MAP_SHARED,
				sharedMemory
			));

		if (!result) {
			sharedMemory.unlink(name);
			return false;
		}

		new (m_event) EventImpl(condAttr, mutexAttr);
		m_name = name;
		return true;
	}